

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

exception<ki::dml::parse_error> *
pybind11::register_exception<ki::dml::parse_error>(handle scope,char *name,PyObject *base)

{
  object *this;
  anon_class_1_0_00000001 local_31;
  object local_30;
  
  this = &detail::get_exception_object<ki::dml::parse_error>()->super_object;
  if ((this->super_handle).m_ptr == (PyObject *)0x0) {
    exception<ki::dml::parse_error>::exception
              ((exception<ki::dml::parse_error> *)&local_30,scope,name,base);
    object::operator=(this,&local_30);
    object::~object(&local_30);
  }
  register_exception_translator<pybind11::register_exception<ki::dml::parse_error>(pybind11::handle,char_const*,_object*)::_lambda(std::__exception_ptr::exception_ptr)_1_>
            (&local_31);
  return (exception<ki::dml::parse_error> *)this;
}

Assistant:

exception<CppException> &register_exception(handle scope,
                                            const char *name,
                                            PyObject *base = PyExc_Exception) {
    auto &ex = detail::get_exception_object<CppException>();
    if (!ex) ex = exception<CppException>(scope, name, base);

    register_exception_translator([](std::exception_ptr p) {
        if (!p) return;
        try {
            std::rethrow_exception(p);
        } catch (const CppException &e) {
            detail::get_exception_object<CppException>()(e.what());
        }
    });
    return ex;
}